

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BpTree2.h
# Opt level: O3

void __thiscall
BpTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::DeleteKey
          (BpTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *k,Addr p)

{
  pointer pcVar1;
  Addr p_00;
  IndexNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> C;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  IndexNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_88;
  
  pcVar1 = (k->_M_dataplus)._M_p;
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_a8,pcVar1,pcVar1 + k->_M_string_length)
  ;
  p_00 = FindLeafAddr(this,&local_a8,p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
  }
  if ((ulong)p_00 < 0xffffffff00000000) {
    IndexNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    IndexNode(&local_88,this->N);
    FindNode(this,p_00,&local_88);
    pcVar1 = (k->_M_dataplus)._M_p;
    local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_c8,pcVar1,pcVar1 + k->_M_string_length);
    Delete_Aux(this,&local_88,&local_c8,p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
      operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
    }
    if (local_88.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_88.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_88.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_88.p.super__Vector_base<Addr,_std::allocator<Addr>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_88.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_88.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_88.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_88.v.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_88.k);
  }
  return;
}

Assistant:

void BpTree<K>::DeleteKey(K k, Addr p) {
	Addr pos = this->FindLeafAddr(k, p);
	if (pos.FileOff != -1) {
		IndexNode<K> C(N);
		this->FindNode(pos, C);
		this->Delete_Aux(C, k, p);
	}
	else
		//cout << "Cannot find the key!" << endl;
	return;
}